

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool Json::OurReader::containsNewLine(Location begin,Location end)

{
  for (; ((begin < end && (*begin != '\n')) && (*begin != '\r')); begin = begin + 1) {
  }
  return begin < end;
}

Assistant:

bool OurReader::containsNewLine(OurReader::Location begin, OurReader::Location end) {
  for (; begin < end; ++begin)
    if (*begin == '\n' || *begin == '\r')
      return true;
  return false;
}